

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reassociation.cpp
# Opt level: O1

bool __thiscall mocker::detail::ReassociationImpl::operator()(ReassociationImpl *this)

{
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  *__return_storage_ptr__;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  _Hash_node_base *p_Var5;
  ReassociationImpl *in_RSI;
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  nodes;
  undefined1 local_88 [40];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
  local_50;
  _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_38;
  
  findRoots(this);
  p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    do {
      local_88._32_8_ = p_Var5[1]._M_nxt;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var5[2]._M_nxt;
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_60->_M_use_count = local_60->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_60->_M_use_count = local_60->_M_use_count + 1;
        }
      }
      buildTrees((ReassociationImpl *)local_88,(shared_ptr<mocker::ir::Addr> *)this,
                 (bool)((char)local_88 + ' '));
      in_RSI = (ReassociationImpl *)(p_Var5 + 1);
      pmVar3 = std::__detail::
               _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::shared_ptr<mocker::detail::ReassociationImpl::Node>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->trees,(key_type *)in_RSI);
      uVar2 = local_88._8_8_;
      uVar1 = local_88._0_8_;
      local_88._0_8_ = (element_type *)0x0;
      local_88._8_8_ = (FunctionModule *)0x0;
      this_00 = (pmVar3->
                super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>
                )._M_refcount._M_pi;
      (pmVar3->
      super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>).
      _M_ptr = (element_type *)uVar1;
      (pmVar3->
      super___shared_ptr<mocker::detail::ReassociationImpl::Node,_(__gnu_cxx::_Lock_policy)2>).
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((FunctionModule *)local_88._8_8_ != (FunctionModule *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
      }
      if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
      }
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  p_Var5 = (this->trees)._M_h._M_before_begin._M_nxt;
  if (p_Var5 != (_Hash_node_base *)0x0) {
    local_38 = (_Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&this->doNotRebuild;
    __return_storage_ptr__ =
         (vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
          *)(local_88 + 0x20);
    do {
      flatten(__return_storage_ptr__,in_RSI,
              (shared_ptr<mocker::detail::ReassociationImpl::Node> *)(p_Var5 + 3));
      if ((ulong)(((long)local_60 - local_88._32_8_ >> 3) * -0x5555555555555555) < 10) {
        in_RSI = (ReassociationImpl *)(p_Var5 + 1);
        std::
        _Hashtable<std::shared_ptr<mocker::ir::Reg>,std::shared_ptr<mocker::ir::Reg>,std::allocator<std::shared_ptr<mocker::ir::Reg>>,std::__detail::_Identity,mocker::ir::RegPtrEqual,mocker::ir::RegPtrHash,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::_M_emplace<std::shared_ptr<mocker::ir::Reg>const&>(local_38);
      }
      cancel(&local_50,in_RSI,__return_storage_ptr__);
      pmVar4 = std::__detail::
               _Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::shared_ptr<mocker::ir::Reg>,_std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>,_std::allocator<std::pair<const_std::shared_ptr<mocker::ir::Reg>,_std::vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>_>_>,_std::__detail::_Select1st,_mocker::ir::RegPtrEqual,_mocker::ir::RegPtrHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&this->flattenedNodes,(key_type *)(p_Var5 + 1));
      local_88._0_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      local_88._8_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      local_88._16_8_ =
           (pmVar4->
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           )._M_impl.super__Vector_impl_data._M_end_of_storage;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start =
           local_50.
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish =
           local_50.
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      (pmVar4->
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      )._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_50.
           super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      in_RSI = (ReassociationImpl *)0x0;
      local_50.
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_50.
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_50.
      super__Vector_base<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector((vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
                 *)local_88);
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector(&local_50);
      std::
      vector<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>,_std::allocator<std::pair<bool,_std::shared_ptr<mocker::ir::Addr>_>_>_>
      ::~vector(__return_storage_ptr__);
      p_Var5 = p_Var5->_M_nxt;
    } while (p_Var5 != (_Hash_node_base *)0x0);
  }
  for (p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
      p_Var5 = p_Var5->_M_nxt) {
    rankNodes(this,(shared_ptr<mocker::ir::Reg> *)(p_Var5 + 1));
  }
  for (p_Var5 = (this->roots)._M_h._M_before_begin._M_nxt; p_Var5 != (_Hash_node_base *)0x0;
      p_Var5 = p_Var5->_M_nxt) {
    rebuild(this,(shared_ptr<mocker::ir::Reg> *)(p_Var5 + 1));
  }
  removeDeletedInsts(this->func);
  return false;
}

Assistant:

bool detail::ReassociationImpl::operator()() {
  findRoots();
  for (auto &root : roots) {
    trees[root] = buildTrees(root, true);
  }
  for (auto &kv : trees) {
    auto nodes = flatten(kv.second);
    if (nodes.size() < 10)
      doNotRebuild.emplace(kv.first);
    flattenedNodes[kv.first] = cancel(nodes);
  }

  for (auto &root : roots) {
    rankNodes(root);
  }

  for (auto &root : roots) {
    rebuild(root);
  }

  removeDeletedInsts(func);

  return false;
}